

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_client_hello(ptls_context_t *ctx,st_ptls_client_hello_t *ch,uint8_t *src,uint8_t *end,
                       ptls_handshake_properties_t *properties,ptls_t *tls_cbarg)

{
  uint8_t uVar1;
  code *pcVar2;
  uint16_t uVar3;
  int iVar4;
  uint8_t *puVar5;
  ptls_handshake_properties_t *ppVar6;
  size_t *psVar7;
  long lVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ptls_iovec_t pVar11;
  uint8_t *local_4e8;
  size_t local_4e0;
  uint8_t *local_4d8;
  size_t local_4d0;
  uint8_t *end_21;
  uint8_t *_src_20;
  uint64_t _block_size64_20;
  size_t _block_size_20;
  size_t _capacity_20;
  size_t local_498;
  uint8_t *end_20;
  uint8_t *_src_19;
  uint64_t _block_size64_19;
  size_t _block_size_19;
  size_t _capacity_19;
  uint8_t *puStack_460;
  uint8_t mode;
  uint8_t *end_19;
  uint8_t *_src_18;
  uint64_t _block_size64_18;
  size_t _block_size_18;
  size_t _capacity_18;
  size_t local_430;
  uint8_t *local_428;
  uint8_t *end_18;
  uint8_t *_src_17;
  uint64_t _block_size64_17;
  size_t _block_size_17;
  size_t _capacity_17;
  size_t num_binders;
  uint8_t *end_17;
  uint8_t *_src_16;
  uint64_t _block_size64_16;
  size_t _block_size_16;
  size_t _capacity_16;
  uint8_t *local_3c8;
  uint8_t *local_3c0;
  uint8_t *end_16;
  uint8_t *_src_15;
  uint64_t _block_size64_15;
  size_t _block_size_15;
  size_t _capacity_15;
  ptls_client_hello_psk_identity_t psk;
  uint8_t *end_15;
  uint8_t *_src_14;
  uint64_t _block_size64_14;
  size_t _block_size_14;
  size_t _capacity_14;
  size_t num_identities;
  size_t local_338;
  uint8_t *end_14;
  uint8_t *_src_13;
  uint64_t _block_size64_13;
  size_t _block_size_13;
  size_t _capacity_13;
  undefined1 auStack_300 [7];
  uint8_t sent_key_share;
  size_t local_2f8;
  uint8_t *local_2f0;
  uint8_t *end_13;
  uint8_t *_src_12;
  uint64_t _block_size64_12;
  size_t _block_size_12;
  size_t _capacity_12;
  uint8_t *end_12;
  uint8_t *_src_11;
  uint64_t _block_size64_11;
  size_t _block_size_11;
  size_t _capacity_11;
  uint8_t *end_11;
  uint8_t *_src_10;
  uint64_t _block_size64_10;
  size_t _block_size_10;
  size_t _capacity_10;
  size_t local_270;
  uint16_t local_262;
  size_t sStack_260;
  uint16_t v;
  size_t i;
  size_t selected_index;
  uint8_t *end_10;
  uint8_t *_src_9;
  uint64_t _block_size64_9;
  size_t _block_size_9;
  size_t _capacity_9;
  size_t local_220;
  ptls_iovec_t local_218;
  uint16_t local_202;
  uint8_t *puStack_200;
  uint16_t id;
  uint8_t *end_9;
  uint8_t *_src_8;
  uint64_t _block_size64_8;
  size_t _block_size_8;
  size_t _capacity_8;
  size_t list_size;
  uint8_t *end_8;
  uint8_t *_src_7;
  uint64_t _block_size64_7;
  size_t _block_size_7;
  size_t _capacity_7;
  size_t local_1a0;
  uint8_t *local_198;
  uint8_t *end_7;
  uint8_t *_src_6;
  uint64_t _block_size64_6;
  size_t _block_size_6;
  size_t _capacity_6;
  uint8_t *end_6;
  uint8_t *_src_5;
  uint64_t _block_size64_5;
  size_t _block_size_5;
  size_t _capacity_5;
  size_t local_140;
  uint8_t *local_138;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  st_ptls_extension_bitmap_t bitmap;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  size_t local_b0;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  size_t local_78;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint16_t exttype;
  uint8_t *start;
  ptls_t *tls_cbarg_local;
  ptls_handshake_properties_t *properties_local;
  uint8_t *end_local;
  uint8_t *src_local;
  st_ptls_client_hello_t *ch_local;
  ptls_context_t *ctx_local;
  
  _capacity._6_2_ = 0;
  _ret = src;
  start = (uint8_t *)tls_cbarg;
  tls_cbarg_local = (ptls_t *)properties;
  properties_local = (ptls_handshake_properties_t *)end;
  end_local = src;
  src_local = (uint8_t *)ch;
  ch_local = (st_ptls_client_hello_t *)ctx;
  _capacity._0_4_ = ptls_decode16(&ch->legacy_version,&end_local,end);
  puVar10 = src_local;
  if ((uint)_capacity == 0) {
    if (*(ushort *)src_local < 0x301) {
      _capacity._0_4_ = 0x46;
    }
    else if ((long)properties_local - (long)end_local < 0x20) {
      _capacity._0_4_ = 0x32;
    }
    else {
      *(uint8_t **)(src_local + 8) = end_local;
      _block_size = 1;
      if (properties_local == (ptls_handshake_properties_t *)(end_local + 0x20)) {
        _capacity._0_4_ = 0x32;
      }
      else {
        _block_size64 = 0;
        end_local = end_local + 0x20;
        do {
          puVar9 = end_local + 1;
          _block_size64 = _block_size64 << 8 | (ulong)*end_local;
          _block_size = _block_size - 1;
          end_local = puVar9;
        } while (_block_size != 0);
        if ((ulong)((long)properties_local - (long)puVar9) < _block_size64) {
          _capacity._0_4_ = 0x32;
        }
        else {
          puVar5 = puVar9 + _block_size64;
          if ((long)puVar5 - (long)puVar9 < 0x21) {
            pVar11 = ptls_iovec_init(puVar9,(long)puVar5 - (long)puVar9);
            puVar9 = src_local;
            _capacity_1 = (size_t)pVar11.base;
            *(size_t *)(puVar10 + 0x10) = _capacity_1;
            local_78 = pVar11.len;
            *(size_t *)(puVar10 + 0x18) = local_78;
            _block_size_1 = 2;
            if ((ulong)((long)properties_local - (long)puVar5) < 2) {
              _capacity._0_4_ = 0x32;
            }
            else {
              _block_size64_1 = 0;
              end_local = puVar5;
              do {
                puVar10 = end_local + 1;
                _block_size64_1 = _block_size64_1 << 8 | (ulong)*end_local;
                _block_size_1 = _block_size_1 - 1;
                end_local = puVar10;
              } while (_block_size_1 != 0);
              if ((ulong)((long)properties_local - (long)puVar10) < _block_size64_1) {
                _capacity._0_4_ = 0x32;
              }
              else {
                ppVar6 = (ptls_handshake_properties_t *)(puVar10 + _block_size64_1);
                if (((long)ppVar6 - (long)puVar10) % 2 == 0) {
                  pVar11 = ptls_iovec_init(puVar10,(long)ppVar6 - (long)puVar10);
                  _capacity_2 = (size_t)pVar11.base;
                  *(size_t *)(puVar9 + 0x38) = _capacity_2;
                  local_b0 = pVar11.len;
                  *(size_t *)(puVar9 + 0x40) = local_b0;
                  _block_size_2 = 1;
                  if (properties_local == ppVar6) {
                    _capacity._0_4_ = 0x32;
                  }
                  else {
                    _block_size64_2 = 0;
                    end_local = (uint8_t *)ppVar6;
                    do {
                      ppVar6 = (ptls_handshake_properties_t *)(end_local + 1);
                      _block_size64_2 = _block_size64_2 << 8 | (ulong)*end_local;
                      _block_size_2 = _block_size_2 - 1;
                      end_local = (uint8_t *)ppVar6;
                    } while (_block_size_2 != 0);
                    if ((ulong)((long)properties_local - (long)ppVar6) < _block_size64_2) {
                      _capacity._0_4_ = 0x32;
                    }
                    else {
                      bitmap.bits = (long)&ppVar6->field_0 + _block_size64_2;
                      if (ppVar6 == (ptls_handshake_properties_t *)bitmap.bits) {
                        _capacity._0_4_ = 0x32;
                      }
                      else {
                        *(ptls_handshake_properties_t **)(src_local + 0x20) = ppVar6;
                        *(uint64_t *)(src_local + 0x28) = bitmap.bits - (long)ppVar6;
                        if ((ptls_handshake_properties_t *)bitmap.bits == properties_local) {
                          _capacity._0_4_ = 0;
                        }
                        else {
                          *(uint64_t *)(src_local + 0x4a8) = bitmap.bits + (2 - (long)_ret);
                          end_local = (uint8_t *)bitmap.bits;
                          memset(&_capacity_3,0,8);
                          _block_size_3 = 2;
                          if ((ulong)((long)properties_local - (long)end_local) < 2) {
                            _capacity._0_4_ = 0x32;
                          }
                          else {
                            _block_size64_3 = 0;
                            do {
                              puVar10 = end_local + 1;
                              _block_size64_3 = _block_size64_3 << 8 | (ulong)*end_local;
                              _block_size_3 = _block_size_3 - 1;
                              end_local = puVar10;
                            } while (_block_size_3 != 0);
                            if ((ulong)((long)properties_local - (long)puVar10) < _block_size64_3) {
                              _capacity._0_4_ = 0x32;
                            }
                            else {
                              _capacity_4 = (size_t)(puVar10 + _block_size64_3);
                              _block_size_3 = 0;
                              while (end_local != (uint8_t *)_capacity_4) {
                                _capacity._0_4_ =
                                     ptls_decode16((uint16_t *)((long)&_capacity + 6),&end_local,
                                                   (uint8_t *)_capacity_4);
                                if ((uint)_capacity != 0) {
                                  return (uint)_capacity;
                                }
                                iVar4 = extension_bitmap_testandset
                                                  ((st_ptls_extension_bitmap_t *)&_capacity_3,1,
                                                   _capacity._6_2_);
                                puVar10 = start;
                                uVar3 = _capacity._6_2_;
                                if (iVar4 == 0) {
                                  return 0x2f;
                                }
                                _block_size_4 = 2;
                                if (_capacity_4 - (long)end_local < 2) {
                                  return 0x32;
                                }
                                _block_size64_4 = 0;
                                do {
                                  puVar9 = end_local + 1;
                                  _block_size64_4 = _block_size64_4 << 8 | (ulong)*end_local;
                                  _block_size_4 = _block_size_4 - 1;
                                  end_local = puVar9;
                                } while (_block_size_4 != 0);
                                if (_capacity_4 - (long)puVar9 < _block_size64_4) {
                                  return 0x32;
                                }
                                local_138 = puVar9 + _block_size64_4;
                                src_local[0x30c] = src_local[0x30c] & 0xfd;
                                if (((ch_local->alpn).list[5].base != (uint8_t *)0x0) &&
                                   (start != (uint8_t *)0x0)) {
                                  pcVar2 = *(code **)(ch_local->alpn).list[5].base;
                                  puVar5 = (ch_local->alpn).list[5].base;
                                  __capacity_5 = ptls_iovec_init(puVar9,(long)local_138 -
                                                                        (long)puVar9);
                                  iVar4 = (*pcVar2)(puVar5,puVar10,1,uVar3,_capacity_5,local_140);
                                  _capacity._0_4_ = (uint)(iVar4 != 0);
                                  if (iVar4 != 0) {
                                    return (uint)_capacity;
                                  }
                                }
                                puVar10 = src_local;
                                if (_capacity._6_2_ == 0) {
                                  iVar4 = client_hello_decode_server_name
                                                    ((ptls_iovec_t *)(src_local + 0x90),&end_local,
                                                     local_138);
                                  if (iVar4 != 0) {
                                    return iVar4;
                                  }
                                  if (end_local != local_138) {
                                    return 0x32;
                                  }
                                  _capacity._0_4_ = 0;
                                }
                                else if (_capacity._6_2_ == 5) {
                                  src_local[0x228] = src_local[0x228] & 0xfe | 1;
                                }
                                else if (_capacity._6_2_ == 10) {
                                  local_218 = ptls_iovec_init(end_local,
                                                              (long)local_138 - (long)end_local);
                                  *(uint8_t **)(puVar10 + 0x48) = local_218.base;
                                  *(size_t *)(puVar10 + 0x50) = local_218.len;
                                }
                                else if (_capacity._6_2_ == 0xd) {
                                  iVar4 = decode_signature_algorithms
                                                    ((st_ptls_signature_algorithms_t *)
                                                     (src_local + 0x68),&end_local,local_138);
                                  if (iVar4 != 0) {
                                    return iVar4;
                                  }
                                  _capacity._0_4_ = 0;
                                }
                                else if (_capacity._6_2_ == 0x10) {
                                  _block_size_5 = 2;
                                  if ((ulong)((long)local_138 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  _block_size64_5 = 0;
                                  do {
                                    puVar10 = end_local + 1;
                                    _block_size64_5 = _block_size64_5 << 8 | (ulong)*end_local;
                                    _block_size_5 = _block_size_5 - 1;
                                    end_local = puVar10;
                                  } while (_block_size_5 != 0);
                                  if ((ulong)((long)local_138 - (long)puVar10) < _block_size64_5) {
                                    return 0x32;
                                  }
                                  _capacity_6 = (size_t)(puVar10 + _block_size64_5);
                                  _block_size_5 = 0;
                                  do {
                                    _block_size_6 = 1;
                                    if ((uint8_t *)_capacity_6 == end_local) {
                                      return 0x32;
                                    }
                                    _block_size64_6 = 0;
                                    do {
                                      puVar10 = end_local + 1;
                                      _block_size64_6 = _block_size64_6 << 8 | (ulong)*end_local;
                                      _block_size_6 = _block_size_6 - 1;
                                      end_local = puVar10;
                                    } while (_block_size_6 != 0);
                                    _block_size_6 = 0;
                                    if (_capacity_6 - (long)puVar10 < _block_size64_6) {
                                      return 0x32;
                                    }
                                    local_198 = puVar10 + _block_size64_6;
                                    if (puVar10 == local_198) {
                                      return 0x32;
                                    }
                                    if (*(ulong *)(src_local + 0x1a0) < 0x10) {
                                      lVar8 = *(long *)(src_local + 0x1a0);
                                      *(long *)(src_local + 0x1a0) = lVar8 + 1;
                                      psVar7 = (size_t *)(src_local + lVar8 * 0x10 + 0xa0);
                                      __capacity_7 = ptls_iovec_init(puVar10,(long)local_198 -
                                                                             (long)puVar10);
                                      *psVar7 = _capacity_7;
                                      psVar7[1] = local_1a0;
                                    }
                                    end_local = local_198;
                                  } while (local_198 != (uint8_t *)_capacity_6);
                                  if (local_198 != (uint8_t *)_capacity_6) {
                                    return 0x32;
                                  }
                                  if (local_198 != local_138) {
                                    return 0x32;
                                  }
                                }
                                else if (_capacity._6_2_ == 0x14) {
                                  _block_size_7 = 1;
                                  if (local_138 == end_local) {
                                    return 0x32;
                                  }
                                  _block_size64_7 = 0;
                                  do {
                                    puVar10 = end_local + 1;
                                    _block_size64_7 = _block_size64_7 << 8 | (ulong)*end_local;
                                    _block_size_7 = _block_size_7 - 1;
                                    end_local = puVar10;
                                  } while (_block_size_7 != 0);
                                  if ((ulong)((long)local_138 - (long)puVar10) < _block_size64_7) {
                                    return 0x32;
                                  }
                                  list_size = (size_t)(puVar10 + _block_size64_7);
                                  _capacity_8 = list_size - (long)puVar10;
                                  if ((_capacity_8 == 0) ||
                                     ((_capacity_8 == 1 && (*puVar10 == '\0')))) {
                                    return 0x32;
                                  }
                                  do {
                                    if (*(ulong *)(src_local + 0x220) < 8) {
                                      uVar1 = *end_local;
                                      lVar8 = *(long *)(src_local + 0x220);
                                      *(long *)(src_local + 0x220) = lVar8 + 1;
                                      src_local[lVar8 + 0x218] = uVar1;
                                    }
                                    end_local = end_local + 1;
                                  } while (end_local != (uint8_t *)list_size);
                                  if (end_local != (uint8_t *)list_size) {
                                    return 0x32;
                                  }
                                  if (end_local != local_138) {
                                    return 0x32;
                                  }
                                  _block_size_7 = 0;
                                }
                                else if (_capacity._6_2_ == 0x1b) {
                                  _block_size_8 = 1;
                                  if (local_138 == end_local) {
                                    return 0x32;
                                  }
                                  _block_size64_8 = 0;
                                  do {
                                    puStack_200 = end_local + 1;
                                    _block_size64_8 = _block_size64_8 << 8 | (ulong)*end_local;
                                    _block_size_8 = _block_size_8 - 1;
                                    end_local = puStack_200;
                                  } while (_block_size_8 != 0);
                                  if ((ulong)((long)local_138 - (long)puStack_200) < _block_size64_8
                                     ) {
                                    return 0x32;
                                  }
                                  puStack_200 = puStack_200 + _block_size64_8;
                                  _block_size_8 = 0;
                                  do {
                                    iVar4 = ptls_decode16(&local_202,&end_local,puStack_200);
                                    if (iVar4 != 0) {
                                      return iVar4;
                                    }
                                    if (*(ulong *)(src_local + 0x1c8) < 0x10) {
                                      lVar8 = *(long *)(src_local + 0x1c8);
                                      *(long *)(src_local + 0x1c8) = lVar8 + 1;
                                      *(uint16_t *)(src_local + lVar8 * 2 + 0x1a8) = local_202;
                                    }
                                    _capacity._0_4_ = 0;
                                  } while (end_local != puStack_200);
                                  if (end_local != puStack_200) {
                                    return 0x32;
                                  }
                                  if (end_local != local_138) {
                                    return 0x32;
                                  }
                                  _capacity._0_4_ = 0;
                                }
                                else if (_capacity._6_2_ == 0x29) {
                                  _block_size_14 = 2;
                                  if ((ulong)((long)local_138 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  _block_size64_14 = 0;
                                  do {
                                    puVar10 = end_local + 1;
                                    _block_size64_14 = _block_size64_14 << 8 | (ulong)*end_local;
                                    _block_size_14 = _block_size_14 - 1;
                                    end_local = puVar10;
                                  } while (_block_size_14 != 0);
                                  _capacity_14 = 0;
                                  if ((ulong)((long)local_138 - (long)puVar10) < _block_size64_14) {
                                    return 0x32;
                                  }
                                  psk.binder.len = (size_t)(puVar10 + _block_size64_14);
                                  do {
                                    memset(&_capacity_15,0,0x28);
                                    _block_size_15 = 2;
                                    if (psk.binder.len - (long)end_local < 2) {
                                      return 0x32;
                                    }
                                    _block_size64_15 = 0;
                                    do {
                                      puVar10 = end_local + 1;
                                      _block_size64_15 = _block_size64_15 << 8 | (ulong)*end_local;
                                      _block_size_15 = _block_size_15 - 1;
                                      end_local = puVar10;
                                    } while (_block_size_15 != 0);
                                    if (psk.binder.len - (long)puVar10 < _block_size64_15) {
                                      return 0x32;
                                    }
                                    local_3c0 = puVar10 + _block_size64_15;
                                    if ((long)local_3c0 - (long)puVar10 < 1) {
                                      return 0x32;
                                    }
                                    __capacity_16 =
                                         ptls_iovec_init(puVar10,(long)local_3c0 - (long)puVar10);
                                    _capacity_15 = _capacity_16;
                                    psk.identity.base = local_3c8;
                                    end_local = local_3c0;
                                    _capacity._0_4_ =
                                         ptls_decode32((uint32_t *)&psk.identity.len,&end_local,
                                                       (uint8_t *)psk.binder.len);
                                    if ((uint)_capacity != 0) {
                                      return (uint)_capacity;
                                    }
                                    if (*(ulong *)(src_local + 0x300) < 4) {
                                      lVar8 = *(long *)(src_local + 0x300);
                                      *(long *)(src_local + 0x300) = lVar8 + 1;
                                      memcpy(src_local + lVar8 * 0x28 + 0x260,&_capacity_15,0x28);
                                    }
                                    _capacity_14 = _capacity_14 + 1;
                                  } while (end_local != (uint8_t *)psk.binder.len);
                                  if (end_local != (uint8_t *)psk.binder.len) {
                                    return 0x32;
                                  }
                                  *(uint8_t **)(src_local + 600) = end_local;
                                  _block_size_16 = 2;
                                  if ((ulong)((long)local_138 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  _block_size64_16 = 0;
                                  do {
                                    puVar10 = end_local + 1;
                                    _block_size64_16 = _block_size64_16 << 8 | (ulong)*end_local;
                                    _block_size_16 = _block_size_16 - 1;
                                    end_local = puVar10;
                                  } while (_block_size_16 != 0);
                                  _block_size_16 = 0;
                                  if ((ulong)((long)local_138 - (long)puVar10) < _block_size64_16) {
                                    return 0x32;
                                  }
                                  num_binders = (size_t)(puVar10 + _block_size64_16);
                                  _capacity_17 = 0;
                                  do {
                                    puVar10 = src_local;
                                    _block_size_17 = 1;
                                    if ((uint8_t *)num_binders == end_local) {
                                      return 0x32;
                                    }
                                    _block_size64_17 = 0;
                                    do {
                                      puVar9 = end_local + 1;
                                      _block_size64_17 = _block_size64_17 << 8 | (ulong)*end_local;
                                      _block_size_17 = _block_size_17 - 1;
                                      end_local = puVar9;
                                    } while (_block_size_17 != 0);
                                    _block_size_17 = 0;
                                    if (num_binders - (long)puVar9 < _block_size64_17) {
                                      return 0x32;
                                    }
                                    local_428 = puVar9 + _block_size64_17;
                                    if (_capacity_17 < *(ulong *)(src_local + 0x300)) {
                                      lVar8 = _capacity_17 * 0x28;
                                      __capacity_18 =
                                           ptls_iovec_init(puVar9,(long)local_428 - (long)puVar9);
                                      *(size_t *)(puVar10 + lVar8 + 0x278) = _capacity_18;
                                      *(size_t *)(puVar10 + lVar8 + 0x280) = local_430;
                                    }
                                    end_local = local_428;
                                    _capacity_17 = _capacity_17 + 1;
                                  } while (local_428 != (uint8_t *)num_binders);
                                  if (_capacity_14 != _capacity_17) {
                                    return 0x2f;
                                  }
                                  if (local_428 != (uint8_t *)num_binders) {
                                    return 0x32;
                                  }
                                  if (local_428 != local_138) {
                                    return 0x32;
                                  }
                                  src_local[0x30c] = src_local[0x30c] & 0xfd | 2;
                                }
                                else if (_capacity._6_2_ == 0x2a) {
                                  src_local[0x30c] = src_local[0x30c] & 0xfe | 1;
                                }
                                else if (_capacity._6_2_ == 0x2b) {
                                  _block_size_9 = 1;
                                  if (local_138 == end_local) {
                                    return 0x32;
                                  }
                                  _block_size64_9 = 0;
                                  do {
                                    puVar10 = end_local + 1;
                                    _block_size64_9 = _block_size64_9 << 8 | (ulong)*end_local;
                                    _block_size_9 = _block_size_9 - 1;
                                    end_local = puVar10;
                                  } while (_block_size_9 != 0);
                                  if ((ulong)((long)local_138 - (long)puVar10) < _block_size64_9) {
                                    return 0x32;
                                  }
                                  selected_index = (size_t)(puVar10 + _block_size64_9);
                                  i = 1;
                                  _block_size_9 = 0;
                                  do {
                                    iVar4 = ptls_decode16(&local_262,&end_local,
                                                          (uint8_t *)selected_index);
                                    if (iVar4 != 0) {
                                      return iVar4;
                                    }
                                    for (sStack_260 = 0; sStack_260 != i;
                                        sStack_260 = sStack_260 + 1) {
                                      if (supported_versions[sStack_260] == local_262) {
                                        i = sStack_260;
                                        break;
                                      }
                                    }
                                    _capacity._0_4_ = 0;
                                  } while (end_local != (uint8_t *)selected_index);
                                  if (i != 1) {
                                    *(uint16_t *)(src_local + 0x30) = supported_versions[i];
                                  }
                                  if (end_local != (uint8_t *)selected_index) {
                                    return 0x32;
                                  }
                                  if (end_local != local_138) {
                                    return 0x32;
                                  }
                                  _capacity._0_4_ = 0;
                                }
                                else if (_capacity._6_2_ == 0x2c) {
                                  if ((tls_cbarg_local == (ptls_t *)0x0) ||
                                     (lVar8._0_1_ = (tls_cbarg_local->recvbuf).mess.is_allocated,
                                     lVar8._1_1_ = (tls_cbarg_local->recvbuf).mess.align_bits,
                                     lVar8._2_6_ = *(undefined6 *)
                                                    &(tls_cbarg_local->recvbuf).mess.field_0x1a,
                                     lVar8 == 0)) {
                                    return 0x2f;
                                  }
                                  __capacity_10 =
                                       ptls_iovec_init(end_local,(long)local_138 - (long)end_local);
                                  puVar9 = src_local;
                                  *(size_t *)(puVar10 + 0x1d0) = _capacity_10;
                                  *(size_t *)(puVar10 + 0x1d8) = local_270;
                                  _block_size_10 = 2;
                                  if ((ulong)((long)local_138 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  _block_size64_10 = 0;
                                  do {
                                    puVar10 = end_local + 1;
                                    _block_size64_10 = _block_size64_10 << 8 | (ulong)*end_local;
                                    _block_size_10 = _block_size_10 - 1;
                                    end_local = puVar10;
                                  } while (_block_size_10 != 0);
                                  if ((ulong)((long)local_138 - (long)puVar10) < _block_size64_10) {
                                    return 0x32;
                                  }
                                  _capacity_11 = (size_t)(puVar10 + _block_size64_10);
                                  *(uint8_t **)(src_local + 0x1e0) = puVar10;
                                  _block_size_11 = 2;
                                  if (_capacity_11 - (long)puVar10 < 2) {
                                    return 0x32;
                                  }
                                  _block_size64_11 = 0;
                                  do {
                                    puVar10 = end_local + 1;
                                    _block_size64_11 = _block_size64_11 << 8 | (ulong)*end_local;
                                    _block_size_11 = _block_size_11 - 1;
                                    end_local = puVar10;
                                  } while (_block_size_11 != 0);
                                  if (_capacity_11 - (long)puVar10 < _block_size64_11) {
                                    return 0x32;
                                  }
                                  _capacity_12 = (size_t)(puVar10 + _block_size64_11);
                                  _block_size_12 = 1;
                                  if ((uint8_t *)_capacity_12 == puVar10) {
                                    return 0x32;
                                  }
                                  _block_size64_12 = 0;
                                  do {
                                    puVar10 = end_local + 1;
                                    _block_size64_12 = _block_size64_12 << 8 | (ulong)*end_local;
                                    _block_size_12 = _block_size_12 - 1;
                                    end_local = puVar10;
                                  } while (_block_size_12 != 0);
                                  _block_size_12 = 0;
                                  if (_capacity_12 - (long)puVar10 < _block_size64_12) {
                                    return 0x32;
                                  }
                                  local_2f0 = puVar10 + _block_size64_12;
                                  _auStack_300 = ptls_iovec_init(puVar10,(long)local_2f0 -
                                                                         (long)puVar10);
                                  *(uint8_t **)(puVar9 + 0x1f0) = _auStack_300;
                                  *(size_t *)(puVar9 + 0x1f8) = local_2f8;
                                  end_local = local_2f0;
                                  _capacity._0_4_ =
                                       ptls_decode8((uint8_t *)((long)&_capacity_13 + 7),&end_local,
                                                    (uint8_t *)_capacity_12);
                                  puVar10 = src_local;
                                  if ((uint)_capacity != 0) {
                                    return (uint)_capacity;
                                  }
                                  if (_capacity_13._7_1_ == '\0') {
                                    if ((src_local[0x210] & 1) != 0) {
                                      __assert_fail("!ch->cookie.sent_key_share",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                                  ,0xec2,
                                                  "int decode_client_hello(ptls_context_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *, ptls_t *)"
                                                  );
                                    }
                                  }
                                  else {
                                    if (_capacity_13._7_1_ != '\x01') {
                                      return 0x32;
                                    }
                                    src_local[0x210] = src_local[0x210] & 0xfe | 1;
                                  }
                                  if (end_local != (uint8_t *)_capacity_12) {
                                    return 0x32;
                                  }
                                  *(long *)(src_local + 0x1e8) =
                                       (long)end_local - *(long *)(src_local + 0x1e0);
                                  _block_size_13 = 1;
                                  if ((uint8_t *)_capacity_11 == end_local) {
                                    return 0x32;
                                  }
                                  _block_size64_13 = 0;
                                  do {
                                    puVar9 = end_local + 1;
                                    _block_size64_13 = _block_size64_13 << 8 | (ulong)*end_local;
                                    _block_size_13 = _block_size_13 - 1;
                                    end_local = puVar9;
                                  } while (_block_size_13 != 0);
                                  if (_capacity_11 - (long)puVar9 < _block_size64_13) {
                                    return 0x32;
                                  }
                                  puVar5 = puVar9 + _block_size64_13;
                                  pVar11 = ptls_iovec_init(puVar9,(long)puVar5 - (long)puVar9);
                                  num_identities = (size_t)pVar11.base;
                                  *(size_t *)(puVar10 + 0x200) = num_identities;
                                  local_338 = pVar11.len;
                                  *(size_t *)(puVar10 + 0x208) = local_338;
                                  if (puVar5 != (uint8_t *)_capacity_11) {
                                    return 0x32;
                                  }
                                  if (puVar5 != (uint8_t *)_capacity_11) {
                                    return 0x32;
                                  }
                                  if (puVar5 != local_138) {
                                    return 0x32;
                                  }
                                }
                                else if (_capacity._6_2_ == 0x2d) {
                                  _block_size_18 = 1;
                                  if (local_138 == end_local) {
                                    return 0x32;
                                  }
                                  _block_size64_18 = 0;
                                  do {
                                    puStack_460 = end_local + 1;
                                    _block_size64_18 = _block_size64_18 << 8 | (ulong)*end_local;
                                    _block_size_18 = _block_size_18 - 1;
                                    end_local = puStack_460;
                                  } while (_block_size_18 != 0);
                                  if ((ulong)((long)local_138 - (long)puStack_460) <
                                      _block_size64_18) {
                                    return 0x32;
                                  }
                                  puStack_460 = puStack_460 + _block_size64_18;
                                  _block_size_18 = 0;
                                  do {
                                    iVar4 = ptls_decode8((uint8_t *)((long)&_capacity_19 + 7),
                                                         &end_local,puStack_460);
                                    if (iVar4 != 0) {
                                      return iVar4;
                                    }
                                    if (_capacity_19._7_1_ < 0x20) {
                                      *(uint *)(src_local + 0x308) =
                                           1 << (_capacity_19._7_1_ & 0x1f) |
                                           *(uint *)(src_local + 0x308);
                                    }
                                    _capacity._0_4_ = 0;
                                  } while (end_local != puStack_460);
                                  if (end_local != puStack_460) {
                                    return 0x32;
                                  }
                                  if (end_local != local_138) {
                                    return 0x32;
                                  }
                                  _capacity._0_4_ = 0;
                                }
                                else if (_capacity._6_2_ == 0x33) {
                                  __capacity_9 = ptls_iovec_init(end_local,
                                                                 (long)local_138 - (long)end_local);
                                  *(size_t *)(puVar10 + 0x58) = _capacity_9;
                                  *(size_t *)(puVar10 + 0x60) = local_220;
                                }
                                else if (_capacity._6_2_ == 0x3a) {
                                  if ((long)local_138 - (long)end_local != 2) {
                                    return 0x32;
                                  }
                                  src_local[0x229] = *end_local;
                                  src_local[0x22a] = end_local[1];
                                }
                                else if (_capacity._6_2_ == 0xfe0d) {
                                  _capacity._0_4_ =
                                       ptls_decode8(src_local + 0x230,&end_local,local_138);
                                  puVar10 = src_local;
                                  if ((uint)_capacity != 0) {
                                    return (uint)_capacity;
                                  }
                                  if (src_local[0x230] == '\0') {
                                    _capacity._0_4_ =
                                         ptls_decode16((uint16_t *)(src_local + 0x232),&end_local,
                                                       local_138);
                                    if ((uint)_capacity != 0) {
                                      return (uint)_capacity;
                                    }
                                    _capacity._0_4_ =
                                         ptls_decode16((uint16_t *)(src_local + 0x234),&end_local,
                                                       local_138);
                                    if ((uint)_capacity != 0) {
                                      return (uint)_capacity;
                                    }
                                    _capacity._0_4_ =
                                         ptls_decode8(src_local + 0x231,&end_local,local_138);
                                    puVar10 = src_local;
                                    if ((uint)_capacity != 0) {
                                      return (uint)_capacity;
                                    }
                                    _block_size_19 = 2;
                                    if ((ulong)((long)local_138 - (long)end_local) < 2) {
                                      return 0x32;
                                    }
                                    _block_size64_19 = 0;
                                    do {
                                      puVar9 = end_local + 1;
                                      _block_size64_19 = _block_size64_19 << 8 | (ulong)*end_local;
                                      _block_size_19 = _block_size_19 - 1;
                                      end_local = puVar9;
                                    } while (_block_size_19 != 0);
                                    if ((ulong)((long)local_138 - (long)puVar9) < _block_size64_19)
                                    {
                                      return 0x32;
                                    }
                                    puVar5 = puVar9 + _block_size64_19;
                                    pVar11 = ptls_iovec_init(puVar9,(long)puVar5 - (long)puVar9);
                                    puVar9 = src_local;
                                    _capacity_20 = (size_t)pVar11.base;
                                    *(size_t *)(puVar10 + 0x238) = _capacity_20;
                                    local_498 = pVar11.len;
                                    *(size_t *)(puVar10 + 0x240) = local_498;
                                    _block_size_20 = 2;
                                    if ((ulong)((long)local_138 - (long)puVar5) < 2) {
                                      return 0x32;
                                    }
                                    _block_size64_20 = 0;
                                    end_local = puVar5;
                                    do {
                                      puVar10 = end_local + 1;
                                      _block_size64_20 = _block_size64_20 << 8 | (ulong)*end_local;
                                      _block_size_20 = _block_size_20 - 1;
                                      end_local = puVar10;
                                    } while (_block_size_20 != 0);
                                    if ((ulong)((long)local_138 - (long)puVar10) < _block_size64_20)
                                    {
                                      return 0x32;
                                    }
                                    if (puVar10 == puVar10 + _block_size64_20) {
                                      return 0x32;
                                    }
                                    pVar11 = ptls_iovec_init(puVar10,(long)(puVar10 +
                                                                           _block_size64_20) -
                                                                     (long)puVar10);
                                    local_4d8 = pVar11.base;
                                    *(uint8_t **)(puVar9 + 0x248) = local_4d8;
                                    local_4d0 = pVar11.len;
                                    *(size_t *)(puVar9 + 0x250) = local_4d0;
                                  }
                                  else {
                                    if (src_local[0x230] != '\x01') {
                                      return 0x2f;
                                    }
                                    if (end_local != local_138) {
                                      return 0x32;
                                    }
                                    pVar11 = ptls_iovec_init("",0);
                                    local_4e8 = pVar11.base;
                                    *(uint8_t **)(puVar10 + 0x248) = local_4e8;
                                    local_4e0 = pVar11.len;
                                    *(size_t *)(puVar10 + 0x250) = local_4e0;
                                  }
                                }
                                else if ((start != (uint8_t *)0x0) &&
                                        (iVar4 = should_collect_unknown_extension
                                                           ((ptls_t *)start,
                                                            (ptls_handshake_properties_t *)
                                                            tls_cbarg_local,_capacity._6_2_),
                                        iVar4 != 0)) {
                                  iVar4 = collect_unknown_extension
                                                    ((ptls_t *)start,_capacity._6_2_,end_local,
                                                     local_138,
                                                     (ptls_raw_extension_t *)(src_local + 0x310));
                                  if (iVar4 != 0) {
                                    return iVar4;
                                  }
                                  _capacity._0_4_ = 0;
                                }
                                end_local = local_138;
                              }
                              if (end_local == (uint8_t *)_capacity_4) {
                                if ((ptls_handshake_properties_t *)end_local == properties_local) {
                                  _capacity._0_4_ = 0;
                                }
                                else {
                                  _capacity._0_4_ = 0x32;
                                }
                              }
                              else {
                                _capacity._0_4_ = 0x32;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  _capacity._0_4_ = 0x32;
                }
              }
            }
          }
          else {
            _capacity._0_4_ = 0x32;
          }
        }
      }
    }
  }
  return (uint)_capacity;
}

Assistant:

static int decode_client_hello(ptls_context_t *ctx, struct st_ptls_client_hello_t *ch, const uint8_t *src, const uint8_t *const end,
                               ptls_handshake_properties_t *properties, ptls_t *tls_cbarg)
{
    const uint8_t *start = src;
    uint16_t exttype = 0;
    int ret;

    /* decode protocol version (do not bare to decode something older than TLS 1.0) */
    if ((ret = ptls_decode16(&ch->legacy_version, &src, end)) != 0)
        goto Exit;
    if (ch->legacy_version < 0x0301) {
        ret = PTLS_ALERT_PROTOCOL_VERSION;
        goto Exit;
    }

    /* skip random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    ch->random_bytes = src;
    src += PTLS_HELLO_RANDOM_SIZE;

    /* skip legacy_session_id */
    ptls_decode_open_block(src, end, 1, {
        if (end - src > 32) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->legacy_session_id = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode and select from ciphersuites */
    ptls_decode_open_block(src, end, 2, {
        if ((end - src) % 2 != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->cipher_suites = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode legacy_compression_methods */
    ptls_decode_open_block(src, end, 1, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->compression_methods.ids = src;
        ch->compression_methods.count = end - src;
        src = end;
    });

    /* In TLS versions 1.2 and earlier CH might not have an extensions block (or they might, see what OpenSSL 1.0.0 sends); so bail
     * out if that is the case after parsing the main variables. Zero is returned as it is a valid ClientHello. However
     * `ptls_t::selected_version` remains zero indicating that no compatible version were found. */
    if (src == end) {
        ret = 0;
        goto Exit;
    }

    /* decode extensions */
    ch->first_extension_at = src - start + 2;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, &exttype, {
        ch->psk.is_last_extension = 0;
        if (ctx->on_extension != NULL && tls_cbarg != NULL &&
            (ret = ctx->on_extension->cb(ctx->on_extension, tls_cbarg, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, exttype,
                                         ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if ((ret = client_hello_decode_server_name(&ch->server_name, &src, end)) != 0)
                goto Exit;
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                do {
                    ptls_decode_open_block(src, end, 1, {
                        /* rfc7301 3.1: empty strings MUST NOT be included */
                        if (src == end) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        if (ch->alpn.count < PTLS_ELEMENTSOF(ch->alpn.list))
                            ch->alpn.list[ch->alpn.count++] = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE:
            ptls_decode_block(src, end, 1, {
                size_t list_size = end - src;

                /* RFC7250 4.1: No empty list, no list with single x509 element */
                if (list_size == 0 || (list_size == 1 && *src == PTLS_CERTIFICATE_TYPE_X509)) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }

                do {
                    if (ch->server_certificate_types.count < PTLS_ELEMENTSOF(ch->server_certificate_types.list))
                        ch->server_certificate_types.list[ch->server_certificate_types.count++] = *src;
                    src++;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE:
            ptls_decode_block(src, end, 1, {
                do {
                    uint16_t id;
                    if ((ret = ptls_decode16(&id, &src, end)) != 0)
                        goto Exit;
                    if (ch->cert_compression_algos.count < PTLS_ELEMENTSOF(ch->cert_compression_algos.list))
                        ch->cert_compression_algos.list[ch->cert_compression_algos.count++] = id;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS:
            ch->negotiated_groups = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS:
            if ((ret = decode_signature_algorithms(&ch->signature_algorithms, &src, end)) != 0)
                goto Exit;
            break;
        case PTLS_EXTENSION_TYPE_KEY_SHARE:
            ch->key_shares = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
            ptls_decode_block(src, end, 1, {
                size_t selected_index = PTLS_ELEMENTSOF(supported_versions);
                do {
                    size_t i;
                    uint16_t v;
                    if ((ret = ptls_decode16(&v, &src, end)) != 0)
                        goto Exit;
                    for (i = 0; i != selected_index; ++i) {
                        if (supported_versions[i] == v) {
                            selected_index = i;
                            break;
                        }
                    }
                } while (src != end);
                if (selected_index != PTLS_ELEMENTSOF(supported_versions))
                    ch->selected_version = supported_versions[selected_index];
            });
            break;
        case PTLS_EXTENSION_TYPE_COOKIE:
            if (properties == NULL || properties->server.cookie.key == NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            ch->cookie.all = ptls_iovec_init(src, end - src);
            ptls_decode_block(src, end, 2, {
                ch->cookie.tbs.base = (void *)src;
                ptls_decode_open_block(src, end, 2, {
                    ptls_decode_open_block(src, end, 1, {
                        ch->cookie.ch1_hash = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    uint8_t sent_key_share;
                    if ((ret = ptls_decode8(&sent_key_share, &src, end)) != 0)
                        goto Exit;
                    switch (sent_key_share) {
                    case 0:
                        assert(!ch->cookie.sent_key_share);
                        break;
                    case 1:
                        ch->cookie.sent_key_share = 1;
                        break;
                    default:
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                });
                ch->cookie.tbs.len = src - ch->cookie.tbs.base;
                ptls_decode_block(src, end, 1, {
                    ch->cookie.signature = ptls_iovec_init(src, end - src);
                    src = end;
                });
            });
            break;
        case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY: {
            size_t num_identities = 0;
            ptls_decode_open_block(src, end, 2, {
                do {
                    ptls_client_hello_psk_identity_t psk = {{NULL}};
                    ptls_decode_open_block(src, end, 2, {
                        if (end - src < 1) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        psk.identity = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    if ((ret = ptls_decode32(&psk.obfuscated_ticket_age, &src, end)) != 0)
                        goto Exit;
                    if (ch->psk.identities.count < PTLS_ELEMENTSOF(ch->psk.identities.list))
                        ch->psk.identities.list[ch->psk.identities.count++] = psk;
                    ++num_identities;
                } while (src != end);
            });
            ch->psk.hash_end = src;
            ptls_decode_block(src, end, 2, {
                size_t num_binders = 0;
                do {
                    ptls_decode_open_block(src, end, 1, {
                        if (num_binders < ch->psk.identities.count)
                            ch->psk.identities.list[num_binders].binder = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    ++num_binders;
                } while (src != end);
                if (num_identities != num_binders) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            });
            ch->psk.is_last_extension = 1;
        } break;
        case PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES:
            ptls_decode_block(src, end, 1, {
                do {
                    uint8_t mode;
                    if ((ret = ptls_decode8(&mode, &src, end)) != 0)
                        goto Exit;
                    if (mode < sizeof(ch->psk.ke_modes) * 8)
                        ch->psk.ke_modes |= 1u << mode;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            ch->psk.early_data_indication = 1;
            break;
        case PTLS_EXTENSION_TYPE_STATUS_REQUEST:
            ch->status_request = 1;
            break;
        case PTLS_EXTENSION_TYPE_TICKET_REQUEST:
            if (end - src != 2) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            ch->ticket_request.new_session_count = *src++;
            ch->ticket_request.resumption_count = *src++;
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO:
            if ((ret = ptls_decode8(&ch->ech.type, &src, end)) != 0)
                goto Exit;
            switch (ch->ech.type) {
            case PTLS_ECH_CLIENT_HELLO_TYPE_OUTER:
                if ((ret = ptls_decode16(&ch->ech.cipher_suite.kdf, &src, end)) != 0 ||
                    (ret = ptls_decode16(&ch->ech.cipher_suite.aead, &src, end)) != 0)
                    goto Exit;
                if ((ret = ptls_decode8(&ch->ech.config_id, &src, end)) != 0)
                    goto Exit;
                ptls_decode_open_block(src, end, 2, {
                    ch->ech.enc = ptls_iovec_init(src, end - src);
                    src = end;
                });
                ptls_decode_open_block(src, end, 2, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    ch->ech.payload = ptls_iovec_init(src, end - src);
                    src = end;
                });
                break;
            case PTLS_ECH_CLIENT_HELLO_TYPE_INNER:
                if (src != end) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }
                ch->ech.payload = ptls_iovec_init("", 0); /* non-zero base indicates that the extension was received */
                break;
            default:
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            src = end;
            break;
        default:
            if (tls_cbarg != NULL && should_collect_unknown_extension(tls_cbarg, properties, exttype)) {
                if ((ret = collect_unknown_extension(tls_cbarg, exttype, src, end, ch->unknown_extensions)) != 0)
                    goto Exit;
            }
            break;
        }
        src = end;
    });

    ret = 0;
Exit:
    return ret;
}